

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86::create_pipeline(MultiHeadAttention_x86 *this,Option *opt)

{
  int *piVar1;
  void *pvVar2;
  long *plVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  Layer *pLVar20;
  long lVar21;
  _func_int *p_Var22;
  float fVar23;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar24;
  undefined1 in_XMM1 [16];
  undefined1 auVar25 [16];
  ParamDict pd;
  Option opt1;
  ParamDict PStack_e8;
  Mat local_d8;
  undefined8 local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_48;
  float local_34;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  
  fVar23 = (float)(*(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]) /
                  *(int *)(&this->field_0xd4 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  auVar25._4_4_ = in_XMM0_Db;
  auVar25._0_4_ = fVar23;
  auVar25._8_4_ = in_XMM0_Dc;
  auVar25._12_4_ = in_XMM0_Dd;
  auVar25 = rsqrtss(in_XMM1,auVar25);
  fVar24 = auVar25._0_4_;
  local_34 = fVar24 * -0.5 * (fVar23 * fVar24 * fVar24 + -3.0);
  pLVar20 = create_layer(0x4a);
  this->q_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,0,local_34);
  ParamDict::set(&PStack_e8,1,1.0);
  ParamDict::set(&PStack_e8,2,0);
  ParamDict::set(&PStack_e8,3,1);
  ParamDict::set(&PStack_e8,4,1);
  ParamDict::set(&PStack_e8,5,0);
  ParamDict::set(&PStack_e8,6,1);
  ParamDict::set(&PStack_e8,7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,8,0);
  ParamDict::set(&PStack_e8,9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,10,1);
  ParamDict::set(&PStack_e8,0xb,0);
  ParamDict::set(&PStack_e8,0xc,1);
  ParamDict::set(&PStack_e8,0xe,0);
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,&PStack_e8);
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0xe8 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0xf0 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.data = *(void **)(&this->field_0xe8 + (long)p_Var22);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf0 + (long)p_Var22);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf0 + (long)p_Var22) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0xf8 + (long)p_Var22);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0xf8 + (long)p_Var22) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x100 + (long)p_Var22);
    local_d8.allocator = *(Allocator **)(&this->field_0x108 + (long)p_Var22);
    local_d8.dims = *(int *)(&this->field_0x110 + (long)p_Var22);
    local_d8.w = *(int *)(&this->field_0x114 + (long)p_Var22);
    local_d8.h = *(int *)(&this->field_0x118 + (long)p_Var22);
    local_d8._52_8_ = *(undefined8 *)(&this->field_0x11c + (long)p_Var22);
    local_d8.cstep = *(size_t *)(&this->field_0x128 + (long)p_Var22);
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_90 = 0;
  if (&local_90 != (undefined8 *)(&this->field_0x130 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x138 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_90 = *(undefined8 *)(&this->field_0x130 + (long)p_Var22);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x138 + (long)p_Var22);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x138 + (long)p_Var22) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x140 + (long)p_Var22);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x140 + (long)p_Var22) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x148 + (long)p_Var22);
    local_70 = *(undefined8 *)(&this->field_0x150 + (long)p_Var22);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x158 + (long)p_Var22);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x158 + (long)p_Var22) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x160 + (long)p_Var22);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x160 + (long)p_Var22) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x168 + (long)p_Var22);
    local_50 = *(undefined8 *)(&this->field_0x170 + (long)p_Var22);
  }
  pLVar20 = this->q_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,opt);
  if (opt->lightmode != false) {
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0xf0 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x108 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0xe8 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0xe8 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x108 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x128 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0xfc + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0xf0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x118 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x120 + (long)p_Var22) = 0;
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x138 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var22) = 0;
  }
  lVar21 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_d8.refcount + lVar21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = *(void **)((long)&local_d8.data + lVar21);
        plVar3 = *(long **)((long)&local_d8.allocator + lVar21);
        if (plVar3 == (long *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar21) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar21) = 0;
    lVar21 = lVar21 + -0x48;
  } while (lVar21 != -0x48);
  ParamDict::~ParamDict(&PStack_e8);
  pLVar20 = create_layer(0x4a);
  this->k_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,2,0);
  ParamDict::set(&PStack_e8,3,1);
  ParamDict::set(&PStack_e8,4,1);
  ParamDict::set(&PStack_e8,5,0);
  ParamDict::set(&PStack_e8,6,1);
  ParamDict::set(&PStack_e8,7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,8,0);
  ParamDict::set(&PStack_e8,9,
                 *(int *)(&this->field_0xdc + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,10,1);
  ParamDict::set(&PStack_e8,0xb,0);
  ParamDict::set(&PStack_e8,0xc,1);
  ParamDict::set(&PStack_e8,0xe,0);
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,&PStack_e8);
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x178 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x180 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.data = *(void **)(&this->field_0x178 + (long)p_Var22);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x180 + (long)p_Var22);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x180 + (long)p_Var22) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x188 + (long)p_Var22);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x188 + (long)p_Var22) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x190 + (long)p_Var22);
    local_d8.allocator = *(Allocator **)(&this->field_0x198 + (long)p_Var22);
    local_d8.dims = *(int *)(&this->field_0x1a0 + (long)p_Var22);
    local_d8.w = *(int *)(&this->field_0x1a4 + (long)p_Var22);
    local_d8.h = *(int *)(&this->field_0x1a8 + (long)p_Var22);
    local_d8._52_8_ = *(undefined8 *)(&this->field_0x1ac + (long)p_Var22);
    local_d8.cstep = *(size_t *)(&this->field_0x1b8 + (long)p_Var22);
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_90 = 0;
  if (&local_90 != (undefined8 *)(&this->field_0x1c0 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x1c8 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_90 = *(undefined8 *)(&this->field_0x1c0 + (long)p_Var22);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var22);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var22) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var22);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var22) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x1d8 + (long)p_Var22);
    local_70 = *(undefined8 *)(&this->field_0x1e0 + (long)p_Var22);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x1e8 + (long)p_Var22);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1e8 + (long)p_Var22) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x1f0 + (long)p_Var22);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1f0 + (long)p_Var22) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x1f8 + (long)p_Var22);
    local_50 = *(undefined8 *)(&this->field_0x200 + (long)p_Var22);
  }
  pLVar20 = this->k_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,opt);
  if (opt->lightmode != false) {
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x180 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x198 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x178 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x178 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x198 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x18c + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1a8 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x1b0 + (long)p_Var22) = 0;
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x1c8 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x1e0 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x1c0 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x1c0 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x1e0 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x200 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1cc + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1d4 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1c0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1c8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1e8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x1f0 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x1f8 + (long)p_Var22) = 0;
  }
  lVar21 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_d8.refcount + lVar21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = *(void **)((long)&local_d8.data + lVar21);
        plVar3 = *(long **)((long)&local_d8.allocator + lVar21);
        if (plVar3 == (long *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar21) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar21) = 0;
    lVar21 = lVar21 + -0x48;
  } while (lVar21 != -0x48);
  ParamDict::~ParamDict(&PStack_e8);
  pLVar20 = create_layer(0x4a);
  this->v_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,2,0);
  ParamDict::set(&PStack_e8,3,1);
  ParamDict::set(&PStack_e8,4,1);
  ParamDict::set(&PStack_e8,5,0);
  ParamDict::set(&PStack_e8,6,1);
  ParamDict::set(&PStack_e8,7,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,8,0);
  ParamDict::set(&PStack_e8,9,
                 *(int *)(&this->field_0xe0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,10,1);
  ParamDict::set(&PStack_e8,0xb,0);
  ParamDict::set(&PStack_e8,0xc,1);
  ParamDict::set(&PStack_e8,0xe,0);
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,&PStack_e8);
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x208 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x210 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.data = *(void **)(&this->field_0x208 + (long)p_Var22);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x210 + (long)p_Var22);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x210 + (long)p_Var22) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x218 + (long)p_Var22);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x218 + (long)p_Var22) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x220 + (long)p_Var22);
    local_d8.allocator = *(Allocator **)(&this->field_0x228 + (long)p_Var22);
    local_d8.dims = *(int *)(&this->field_0x230 + (long)p_Var22);
    local_d8.w = *(int *)(&this->field_0x234 + (long)p_Var22);
    local_d8.h = *(int *)(&this->field_0x238 + (long)p_Var22);
    local_d8._52_8_ = *(undefined8 *)(&this->field_0x23c + (long)p_Var22);
    local_d8.cstep = *(size_t *)(&this->field_0x248 + (long)p_Var22);
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_90 = 0;
  if (&local_90 != (undefined8 *)(&this->field_0x250 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x258 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_90 = *(undefined8 *)(&this->field_0x250 + (long)p_Var22);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x258 + (long)p_Var22);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x258 + (long)p_Var22) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x260 + (long)p_Var22);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x260 + (long)p_Var22) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x268 + (long)p_Var22);
    local_70 = *(undefined8 *)(&this->field_0x270 + (long)p_Var22);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x278 + (long)p_Var22);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x278 + (long)p_Var22) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x280 + (long)p_Var22);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x280 + (long)p_Var22) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x288 + (long)p_Var22);
    local_50 = *(undefined8 *)(&this->field_0x290 + (long)p_Var22);
  }
  pLVar20 = this->v_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,opt);
  if (opt->lightmode != false) {
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x210 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x228 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x208 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x208 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x228 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x248 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x214 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x21c + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x208 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x210 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x230 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x238 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x240 + (long)p_Var22) = 0;
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x258 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x270 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x250 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x250 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x270 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x290 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x25c + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x264 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x250 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x258 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x278 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x280 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x288 + (long)p_Var22) = 0;
  }
  lVar21 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_d8.refcount + lVar21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = *(void **)((long)&local_d8.data + lVar21);
        plVar3 = *(long **)((long)&local_d8.allocator + lVar21);
        if (plVar3 == (long *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar21) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar21) = 0;
    lVar21 = lVar21 + -0x48;
  } while (lVar21 != -0x48);
  ParamDict::~ParamDict(&PStack_e8);
  pLVar20 = create_layer(0x4a);
  this->qk_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,2,1);
  ParamDict::set(&PStack_e8,3,0);
  ParamDict::set(&PStack_e8,4,0);
  ParamDict::set(&PStack_e8,5,0);
  ParamDict::set(&PStack_e8,6,
                 (uint)(*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3])
                       == 0));
  ParamDict::set(&PStack_e8,7,0);
  ParamDict::set(&PStack_e8,8,0);
  ParamDict::set(&PStack_e8,9,0);
  ParamDict::set(&PStack_e8,10,
                 -(uint)(*(int *)(&this->field_0xe4 + (long)this->_vptr_MultiHeadAttention_x86[-3])
                        == 0) | 3);
  ParamDict::set(&PStack_e8,0xb,0);
  ParamDict::set(&PStack_e8,0xc,1);
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar20 = this->qk_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_d8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  local_d8.refcount._0_4_ = *(undefined4 *)&opt->blob_allocator;
  local_d8.refcount._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar4 = opt->openmp_blocktime;
  uVar5 = opt->use_winograd_convolution;
  uVar7 = opt->use_sgemm_convolution;
  uVar9 = opt->use_int8_inference;
  uVar11 = opt->use_vulkan_compute;
  uVar10 = CONCAT11(uVar11,uVar9);
  uVar8 = CONCAT21(uVar10,uVar7);
  uVar6 = CONCAT31(uVar8,uVar5);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8.dims._0_1_ = opt->use_shader_pack8;
  local_d8.dims._1_1_ = opt->use_subgroup_basic;
  local_d8.dims._2_1_ = opt->use_subgroup_vote;
  local_d8.dims._3_1_ = opt->use_subgroup_ballot;
  local_d8.w._0_1_ = opt->use_subgroup_shuffle;
  local_d8.w._1_1_ = opt->use_image_storage;
  local_d8.w._2_1_ = opt->use_tensor_storage;
  local_d8.w._3_1_ = opt->use_reserved_0;
  local_d8.h = opt->flush_denormals;
  local_d8._52_8_ = *(undefined8 *)&opt->use_local_pool_allocator;
  local_d8._60_1_ = opt->use_reserved_8;
  local_d8._61_1_ = opt->use_reserved_9;
  local_d8._62_1_ = opt->use_reserved_10;
  local_d8._63_1_ = opt->use_reserved_11;
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data = (void *)CONCAT44(1,*(undefined4 *)opt);
  local_d8.elempack = uVar4;
  local_d8._28_4_ = uVar6;
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&local_d8);
  ParamDict::~ParamDict(&PStack_e8);
  pLVar20 = create_layer(0x4a);
  this->qkv_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,2,0);
  ParamDict::set(&PStack_e8,3,1);
  ParamDict::set(&PStack_e8,4,0);
  ParamDict::set(&PStack_e8,5,0);
  ParamDict::set(&PStack_e8,6,1);
  ParamDict::set(&PStack_e8,7,0);
  ParamDict::set(&PStack_e8,8,0);
  ParamDict::set(&PStack_e8,9,0);
  ParamDict::set(&PStack_e8,10,-1);
  ParamDict::set(&PStack_e8,0xb,0);
  ParamDict::set(&PStack_e8,0xc,1);
  ParamDict::set(&PStack_e8,0xe,1);
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar20 = this->qkv_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8,(Mat *)0x0);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_d8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_d8);
  local_d8.refcount._0_4_ = *(undefined4 *)&opt->blob_allocator;
  local_d8.refcount._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  uVar12 = opt->openmp_blocktime;
  uVar13 = opt->use_winograd_convolution;
  uVar15 = opt->use_sgemm_convolution;
  uVar17 = opt->use_int8_inference;
  uVar19 = opt->use_vulkan_compute;
  uVar18 = CONCAT11(uVar19,uVar17);
  uVar16 = CONCAT21(uVar18,uVar15);
  uVar14 = CONCAT31(uVar16,uVar13);
  local_d8.allocator = *(Allocator **)&opt->use_bf16_storage;
  local_d8.dims._0_1_ = opt->use_shader_pack8;
  local_d8.dims._1_1_ = opt->use_subgroup_basic;
  local_d8.dims._2_1_ = opt->use_subgroup_vote;
  local_d8.dims._3_1_ = opt->use_subgroup_ballot;
  local_d8.w._0_1_ = opt->use_subgroup_shuffle;
  local_d8.w._1_1_ = opt->use_image_storage;
  local_d8.w._2_1_ = opt->use_tensor_storage;
  local_d8.w._3_1_ = opt->use_reserved_0;
  local_d8.h = opt->flush_denormals;
  local_d8._52_8_ = *(undefined8 *)&opt->use_local_pool_allocator;
  local_d8._60_1_ = opt->use_reserved_8;
  local_d8._61_1_ = opt->use_reserved_9;
  local_d8._62_1_ = opt->use_reserved_10;
  local_d8._63_1_ = opt->use_reserved_11;
  local_d8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
  local_d8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
  local_d8.data = (void *)CONCAT44(1,*(undefined4 *)opt);
  local_d8.elempack = uVar12;
  local_d8._28_4_ = uVar14;
  (*this->qkv_gemm->_vptr_Layer[4])();
  ParamDict::~ParamDict(&PStack_e8);
  pLVar20 = create_layer(0x20);
  this->qk_softmax = pLVar20;
  ParamDict::ParamDict((ParamDict *)&local_d8);
  ParamDict::set((ParamDict *)&local_d8,0,-1);
  ParamDict::set((ParamDict *)&local_d8,1,1);
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar20 = this->qk_softmax;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_e8,(Mat *)0x0);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&PStack_e8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_e8);
  (*this->qk_softmax->_vptr_Layer[4])(this->qk_softmax,opt);
  ParamDict::~ParamDict((ParamDict *)&local_d8);
  pLVar20 = create_layer(0x4a);
  this->o_gemm = pLVar20;
  ParamDict::ParamDict(&PStack_e8);
  ParamDict::set(&PStack_e8,2,1);
  ParamDict::set(&PStack_e8,3,1);
  ParamDict::set(&PStack_e8,4,0);
  ParamDict::set(&PStack_e8,5,1);
  ParamDict::set(&PStack_e8,6,1);
  ParamDict::set(&PStack_e8,7,0);
  ParamDict::set(&PStack_e8,8,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,9,
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_MultiHeadAttention_x86[-3]));
  ParamDict::set(&PStack_e8,10,4);
  ParamDict::set(&PStack_e8,0xb,0);
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,&PStack_e8);
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  if (&local_d8 != (Mat *)(&this->field_0x298 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x2a0 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.data = *(void **)(&this->field_0x298 + (long)p_Var22);
    local_d8.refcount._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var22);
    local_d8.refcount._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a0 + (long)p_Var22) >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var22);
    local_d8.elemsize._4_4_ =
         (undefined4)((ulong)*(undefined8 *)(&this->field_0x2a8 + (long)p_Var22) >> 0x20);
    local_d8.elempack = *(int *)(&this->field_0x2b0 + (long)p_Var22);
    local_d8.allocator = *(Allocator **)(&this->field_0x2b8 + (long)p_Var22);
    local_d8.dims = *(int *)(&this->field_0x2c0 + (long)p_Var22);
    local_d8.w = *(int *)(&this->field_0x2c4 + (long)p_Var22);
    local_d8.h = *(int *)(&this->field_0x2c8 + (long)p_Var22);
    local_d8._52_8_ = *(undefined8 *)(&this->field_0x2cc + (long)p_Var22);
    local_d8.cstep = *(size_t *)(&this->field_0x2d8 + (long)p_Var22);
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
  }
  local_50 = 0;
  local_58 = 0;
  uStack_5c = 0;
  uStack_60 = 0;
  uStack_64 = 0;
  uStack_68 = 0;
  local_70 = 0;
  local_78 = 0;
  uStack_7c = 0;
  local_80 = 0;
  uStack_84 = 0;
  uStack_88 = 0;
  local_90 = 0;
  if (&local_90 != (undefined8 *)(&this->field_0x2e0 + (long)p_Var22)) {
    piVar1 = *(int **)(&this->field_0x2e8 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_90 = *(undefined8 *)(&this->field_0x2e0 + (long)p_Var22);
    uStack_88 = (undefined4)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var22);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2e8 + (long)p_Var22) >> 0x20);
    local_80 = (undefined4)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var22);
    uStack_7c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x2f0 + (long)p_Var22) >> 0x20);
    local_78 = *(undefined4 *)(&this->field_0x2f8 + (long)p_Var22);
    local_70 = *(undefined8 *)(&this->field_0x300 + (long)p_Var22);
    uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x308 + (long)p_Var22);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x308 + (long)p_Var22) >> 0x20);
    uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x310 + (long)p_Var22);
    uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x310 + (long)p_Var22) >> 0x20);
    local_58 = *(undefined4 *)(&this->field_0x318 + (long)p_Var22);
    local_50 = *(undefined8 *)(&this->field_0x320 + (long)p_Var22);
  }
  pLVar20 = this->o_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_48,&local_d8);
  (*pLVar20->_vptr_Layer[3])(pLVar20,&local_48);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_48);
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,opt);
  if (opt->lightmode != false) {
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x2a0 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x2b8 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x298 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x298 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x2b8 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x2d8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2a4 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2ac + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x298 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2a0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2c0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2c8 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x2d0 + (long)p_Var22) = 0;
    p_Var22 = this->_vptr_MultiHeadAttention_x86[-3];
    piVar1 = *(int **)(&this->field_0x2e8 + (long)p_Var22);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x300 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x2e0 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x2e0 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x300 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x320 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2ec + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2f4 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2e0 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x2e8 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x308 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x310 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x318 + (long)p_Var22) = 0;
  }
  lVar21 = 0x48;
  do {
    piVar1 = *(int **)((long)&local_d8.refcount + lVar21);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = *(void **)((long)&local_d8.data + lVar21);
        plVar3 = *(long **)((long)&local_d8.allocator + lVar21);
        if (plVar3 == (long *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_d8.cstep + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.elemsize + lVar21 + 4) = 0;
    *(undefined8 *)((long)&local_d8.data + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.refcount + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.dims + lVar21) = 0;
    *(undefined8 *)((long)&local_d8.h + lVar21) = 0;
    *(undefined4 *)((long)&local_d8.c + lVar21) = 0;
    lVar21 = lVar21 + -0x48;
  } while (lVar21 != -0x48);
  ParamDict::~ParamDict(&PStack_e8);
  return 0;
}

Assistant:

int MultiHeadAttention_x86::create_pipeline(const Option& opt)
{
    {
        const int embed_dim_per_head = embed_dim / num_heads;
        const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

        q_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, inv_sqrt_embed_dim_per_head);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, embed_dim); // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        q_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        k_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
        v_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }
    {
        qkv_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    {
        qk_softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    {
        o_gemm = ncnn::create_layer(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, embed_dim); // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        o_gemm->load_param(pd);
        Mat weights[2];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    return 0;
}